

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nesintf.c
# Opt level: O3

void nes_render_fds(void *chip_fds,UINT32 samples,DEV_SMPL **outputs)

{
  ulong uVar1;
  INT32 Buffer [2];
  int local_30;
  int local_2c;
  
  if (samples != 0) {
    uVar1 = 0;
    do {
      NES_FDS_Render(chip_fds,&local_30);
      (*outputs)[uVar1] = (*outputs)[uVar1] + local_30;
      outputs[1][uVar1] = outputs[1][uVar1] + local_2c;
      uVar1 = uVar1 + 1;
    } while (samples != uVar1);
  }
  return;
}

Assistant:

static void nes_render_fds(void* chip_fds, UINT32 samples, DEV_SMPL** outputs)
{
	UINT32 CurSmpl;
	INT32 Buffer[2];
	
	for (CurSmpl = 0; CurSmpl < samples; CurSmpl ++)
	{
		NES_FDS_Render(chip_fds, &Buffer[0]);
		outputs[0][CurSmpl] += Buffer[0];
		outputs[1][CurSmpl] += Buffer[1];
	}
	
	return;
}